

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void miniros::getPid(XmlRpcValue *params,XmlRpcValue *result)

{
  string *in_RSI;
  undefined8 in_RDI;
  allocator<char> local_41;
  string local_40 [16];
  allocator<char> *in_stack_ffffffffffffffd0;
  XmlRpcValue *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  int code;
  
  code = (int)((ulong)in_RDI >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  getpid();
  xmlrpc::responseInt(code,in_RSI,in_stack_ffffffffffffffec);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x49578d);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void getPid(const XmlRpcValue& params, XmlRpcValue& result)
{
  (void)params;
  result = xmlrpc::responseInt(1, "", (int)getpid());
}